

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

Snapshot * __thiscall
cmState::Snapshot::GetBuildsystemDirectoryParent(Snapshot *__return_storage_ptr__,Snapshot *this)

{
  cmState *state;
  bool bVar1;
  PointerType pSVar2;
  PointerType pBVar3;
  bool local_69;
  Snapshot local_58;
  iterator local_40;
  undefined1 local_30 [8];
  PositionType parentPos;
  Snapshot *this_local;
  
  Snapshot(__return_storage_ptr__,(cmState *)0x0);
  local_69 = true;
  if (this->State != (cmState *)0x0) {
    join_0x00000010_0x00000000_ =
         cmLinkedTree<cmState::SnapshotDataType>::Root(&this->State->SnapshotData);
    local_69 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator==
                         (&this->Position,join_0x00000010_0x00000000_);
  }
  if (local_69 == false) {
    pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
    local_30 = (undefined1  [8])(pSVar2->DirectoryParent).Tree;
    parentPos.Tree = (cmLinkedTree<cmState::SnapshotDataType> *)(pSVar2->DirectoryParent).Position;
    local_40 = cmLinkedTree<cmState::SnapshotDataType>::Root(&this->State->SnapshotData);
    bVar1 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator!=
                      ((iterator *)local_30,local_40);
    if (bVar1) {
      state = this->State;
      pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->((iterator *)local_30);
      pBVar3 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                         (&pSVar2->BuildSystemDirectory);
      Snapshot(&local_58,state,pBVar3->DirectoryEnd);
      __return_storage_ptr__->State = local_58.State;
      (__return_storage_ptr__->Position).Tree = local_58.Position.Tree;
      (__return_storage_ptr__->Position).Position = local_58.Position.Position;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot cmState::Snapshot::GetBuildsystemDirectoryParent() const
{
  Snapshot snapshot;
  if (!this->State || this->Position == this->State->SnapshotData.Root())
    {
    return snapshot;
    }
  PositionType parentPos = this->Position->DirectoryParent;
  if (parentPos != this->State->SnapshotData.Root())
    {
    snapshot = Snapshot(this->State,
                        parentPos->BuildSystemDirectory->DirectoryEnd);
    }

  return snapshot;
}